

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_intersects(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *b2;
  undefined8 uVar2;
  bitset_t *bitset_00;
  int i;
  ulong i_00;
  
  bitset = bitset_create();
  b2 = bitset_create();
  _Var1 = bitset_empty(bitset);
  if (_Var1) {
    for (i_00 = 0; i_00 != 1000; i_00 = i_00 + 1) {
      bitset_00 = b2;
      if ((i_00 & 1) == 0) {
        bitset_00 = bitset;
      }
      bitset_set(bitset_00,i_00);
    }
    _Var1 = bitsets_intersect(bitset,b2);
    if (_Var1) {
      uVar2 = 199;
    }
    else {
      bitset_set(bitset,0x3e9);
      bitset_set(b2,0x3e9);
      _Var1 = bitsets_intersect(bitset,b2);
      if (_Var1) {
        bitset_free(bitset);
        bitset_free(b2);
        return;
      }
      uVar2 = 0xcc;
    }
  }
  else {
    uVar2 = 0xbe;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_intersects",uVar2);
  exit(1);
}

Assistant:

void test_intersects() {
  bitset_t *evens = bitset_create();
  bitset_t *odds = bitset_create();
  TEST_ASSERT(bitset_empty(evens));

  for (int i = 0; i < 1000; i++) {
    if (i % 2 == 0)
      bitset_set(evens, i);
    else
      bitset_set(odds, i);
  }

  TEST_ASSERT(!bitsets_intersect(evens, odds));

  bitset_set(evens, 1001);
  bitset_set(odds, 1001);

  TEST_ASSERT(bitsets_intersect(evens, odds));

  bitset_free(evens);
  bitset_free(odds);
}